

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void spell_ironskin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_ironskin);
  if (!bVar1) {
    bVar1 = is_affected(ch,(int)gsn_diamondskin);
    if (!bVar1) {
      bVar1 = is_affected(ch,(int)gsn_stoneskin);
      if (!bVar1) {
        act("Your skin hardens and takes on a metallic tone.",ch,(void *)0x0,(void *)0x0,3);
        act("$n\'s skin hardens and takes on a metallic tone.",ch,(void *)0x0,(void *)0x0,0);
        init_affect(&af);
        af.where = 0;
        af.aftype = 0;
        af.type = gsn_ironskin;
        af.level = (short)level;
        af.modifier = (short)((long)level / 3);
        af.location = 0x11;
        af.duration = (short)(level / 4);
        af.end_fun = (AFF_FUN *)0x0;
        af.owner = ch;
        new_affect_to_char(ch,&af);
        af.where = 4;
        af.location = 0;
        af.modifier = 0;
        af.mod_name = 0xc;
        af.bitvector[0]._1_1_ = af.bitvector[0]._1_1_ | 2;
        new_affect_to_char(ch,&af);
        return;
      }
    }
  }
  send_to_char("Your skin is already magically hardened.\n\r",ch);
  return;
}

Assistant:

void spell_ironskin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_ironskin) || is_affected(ch, gsn_diamondskin) || is_affected(ch, gsn_stoneskin))
	{
		send_to_char("Your skin is already magically hardened.\n\r", ch);
		return;
	}

	act("Your skin hardens and takes on a metallic tone.", ch, 0, 0, TO_CHAR);
	act("$n's skin hardens and takes on a metallic tone.", ch, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_ironskin;
	af.owner = ch;
	af.level = level;
	af.location = APPLY_AC;
	af.modifier = level / 3;
	af.duration = level / 4;
	af.end_fun = nullptr;
	new_affect_to_char(ch, &af);

	af.where = TO_VULN;
	af.location = 0;
	af.modifier = 0;
	af.mod_name = MOD_RESISTANCE;
	SET_BIT(af.bitvector, VULN_LIGHTNING);
	new_affect_to_char(ch, &af);
}